

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ERK.h
# Opt level: O0

void __thiscall RK4::~RK4(RK4 *this)

{
  RK4 *this_local;
  
  Mat::~Mat(&this->k_4_);
  Mat::~Mat(&this->k_3_);
  Mat::~Mat(&this->k_2_);
  Mat::~Mat(&this->k_1_);
  Mat::~Mat(&this->u_vec_);
  Mat::~Mat(&this->y_0_);
  Mat::~Mat(&this->Y_Out_);
  Mat::~Mat(&this->y_out_);
  return;
}

Assistant:

RK4(Derivs2 f, int n_eqn, double t_initial, double t_final, Mat y_0, double h, Mat& u_vec) 
    : f_(f), n_eqn_(n_eqn), t_initial_(t_initial), t_final_(t_final), y_0_(y_0), h_(h), u_vec_(u_vec)
    {
		clock_t t1_ = clock();
		k_1_ = Mat(n_eqn_);
		k_2_ = k_1_;
		k_3_ = k_2_;
		k_4_ = k_3_;	
		y_out_ = Mat(n_eqn_);	
		n_steps_ = (int)(t_final_ - t_initial_) / h_;
		Y_Out_ = Mat(n_eqn_, n_steps_+1);
		Y_Out_.SetCol(0,y_0_);		
		n_fevals_ = 0;
		n_steps_  = 0;
		n_fails_  = 0;
		time_ = clock() - t1_;
	}